

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallExportGenerator::GenerateScriptActions
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  cmInstallExportGenerator *this_00;
  ostream *poVar1;
  Indent IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  string installedFile;
  string installedDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_a0;
  cmInstallExportGenerator *local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  string local_58;
  string *local_38;
  
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"$ENV{DESTDIR}","");
  local_38 = &(this->super_cmInstallGenerator).Destination;
  cmInstallGenerator::ConvertToAbsoluteDestination
            (&local_a0,&this->super_cmInstallGenerator,local_38);
  std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_78);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_78,(long)local_78 + local_70);
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(this->FileName)._M_dataplus._M_p);
  IVar2.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar2.Level = IVar2.Level + -1;
    } while (IVar2.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(EXISTS \"",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  iVar5 = indent.Level + 2;
  iVar3 = iVar5;
  local_80 = this;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"file(DIFFERENT EXPORT_FILE_CHANGED FILES\n",0x29);
  iVar3 = iVar5;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"     \"",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"\n",2);
  iVar3 = iVar5;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"     \"",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(local_80->MainImportFile)._M_dataplus._M_p,
                      (local_80->MainImportFile)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  iVar3 = iVar5;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(EXPORT_FILE_CHANGED)\n",0x18);
  iVar4 = indent.Level + 4;
  iVar3 = iVar4;
  if (-4 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"file(GLOB OLD_CONFIG_FILES \"",0x1c);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_78,local_70);
  cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_(&local_58,local_80->EFGen);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  iVar3 = iVar4;
  if (-4 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(OLD_CONFIG_FILES)\n",0x15);
  iVar6 = indent.Level + 6;
  iVar3 = iVar6;
  if (-6 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"message(STATUS \"Old export file \\\"",0x22);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n",0x3e);
  if (-6 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"file(REMOVE ${OLD_CONFIG_FILES})\n",0x21);
  if (-4 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  IVar2.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar2.Level = IVar2.Level + -1;
    } while (IVar2.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  this_00 = local_80;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58,&local_80->MainImportFile);
  cmInstallGenerator::AddInstallRule
            (&this_00->super_cmInstallGenerator,os,local_38,cmInstallType_FILES,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58,false,(this_00->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             (char *)0x0,indent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptActions(std::ostream& os,
                                                     Indent indent)
{
  // Remove old per-configuration export files if the main changes.
  std::string installedDir = "$ENV{DESTDIR}";
  installedDir += this->ConvertToAbsoluteDestination(this->Destination);
  installedDir += "/";
  std::string installedFile = installedDir;
  installedFile += this->FileName;
  os << indent << "if(EXISTS \"" << installedFile << "\")\n";
  Indent indentN = indent.Next();
  Indent indentNN = indentN.Next();
  Indent indentNNN = indentNN.Next();
  /* clang-format off */
  os << indentN << "file(DIFFERENT EXPORT_FILE_CHANGED FILES\n"
     << indentN << "     \"" << installedFile << "\"\n"
     << indentN << "     \"" << this->MainImportFile << "\")\n";
  os << indentN << "if(EXPORT_FILE_CHANGED)\n";
  os << indentNN << "file(GLOB OLD_CONFIG_FILES \"" << installedDir
     << this->EFGen->GetConfigImportFileGlob() << "\")\n";
  os << indentNN << "if(OLD_CONFIG_FILES)\n";
  os << indentNNN << "message(STATUS \"Old export file \\\"" << installedFile
     << "\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n";
  os << indentNNN << "file(REMOVE ${OLD_CONFIG_FILES})\n";
  os << indentNN << "endif()\n";
  os << indentN << "endif()\n";
  os << indent << "endif()\n";
  /* clang-format on */

  // Install the main export file.
  std::vector<std::string> files;
  files.push_back(this->MainImportFile);
  this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                       false, this->FilePermissions.c_str(), CM_NULLPTR,
                       CM_NULLPTR, CM_NULLPTR, indent);
}